

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestOneof2_FooGroup::~TestOneof2_FooGroup(TestOneof2_FooGroup *this)

{
  TestOneof2_FooGroup *this_local;
  
  ~TestOneof2_FooGroup(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TestOneof2_FooGroup::~TestOneof2_FooGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestOneof2.FooGroup)
  SharedDtor(*this);
}